

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.cpp
# Opt level: O0

void __thiscall phaeton::ASTVisitor::visitProgram(ASTVisitor *this,Program *Prog)

{
  DeclList *pDVar1;
  ElementDirective *pEVar2;
  StmtList *pSVar3;
  ElementDirective *ED;
  Program *Prog_local;
  ASTVisitor *this_local;
  
  pDVar1 = Program::getDecls(Prog);
  (*(pDVar1->
    super_ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>).
    super_ASTNode._vptr_ASTNode[2])(pDVar1,this);
  pEVar2 = Program::getElem(Prog);
  if (pEVar2 != (ElementDirective *)0x0) {
    (*(pEVar2->super_ASTNode)._vptr_ASTNode[2])(pEVar2,this);
  }
  pSVar3 = Program::getStmts(Prog);
  (*(pSVar3->
    super_ASTNodeList<const_phaeton::Stmt,_(phaeton::ASTNode::ASTNodeKind)2,_phaeton::StmtList>).
    super_ASTNode._vptr_ASTNode[2])(pSVar3,this);
  return;
}

Assistant:

void ASTVisitor::visitProgram(const Program *Prog) {
  Prog->getDecls()->visit(this);

  // Note: the element directive may not be present in a program,
  // so 'ed == nullptr' is possible. we need to process this corner case.
  const ElementDirective *ED = Prog->getElem();
  if (ED) {
    ED->visit(this);
  }

  Prog->getStmts()->visit(this);
}